

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O3

void __thiscall doctest::detail::ResultBuilder::translateException(ResultBuilder *this)

{
  String *pSVar1;
  char *pcVar2;
  char *local_30;
  undefined8 uStack_28;
  undefined7 local_20;
  char cStack_19;
  
  (this->super_AssertData).m_threw = true;
  anon_unknown_15::translateActiveException();
  pSVar1 = &(this->super_AssertData).m_exception;
  if (pSVar1 == (String *)&local_30) {
    if ((cStack_19 < '\0') && (local_30 != (char *)0x0)) {
      operator_delete__(local_30);
    }
  }
  else {
    if (((this->super_AssertData).m_exception.field_0.buf[0x17] < '\0') &&
       (pcVar2 = (pSVar1->field_0).data.ptr, pcVar2 != (char *)0x0)) {
      operator_delete__(pcVar2);
    }
    *(ulong *)((long)&(this->super_AssertData).m_exception.field_0 + 0x10) =
         CONCAT17(cStack_19,local_20);
    (pSVar1->field_0).data.ptr = local_30;
    *(undefined8 *)((long)&(this->super_AssertData).m_exception.field_0 + 8) = uStack_28;
  }
  return;
}

Assistant:

void ResultBuilder::translateException() {
        m_threw     = true;
        m_exception = translateActiveException();
    }